

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O2

void __thiscall CompoundFile::File::File(File *this,istream *stream,string *fileName)

{
  _Rb_tree_header *p_Var1;
  
  std::ifstream::ifstream(this);
  this->m_stream = stream;
  (this->m_header).m_byteOrder = LittleEndian;
  (this->m_header).m_sectorSize = 0;
  (this->m_header).m_shortSectorSize = 0;
  (this->m_header).m_sectorsInSAT = 0;
  (this->m_header).m_dirStreamSecID = 0;
  (this->m_header).m_streamMinSize = 0;
  (this->m_header).m_ssatFirstSecID = 0;
  (this->m_header).m_sectorsInSSAT = 0;
  (this->m_header).m_msatFirstSecID = 0;
  *(undefined8 *)&(this->m_header).m_sectorsInMSAT = 0;
  *(undefined8 *)
   ((long)&(this->m_sat).m_sat.
           super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_sat).m_sat.
           super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_sat).m_sat.
           super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_ssat).m_sat.
           super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_ssat).m_sat.
           super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_ssat).m_sat.
           super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0xfffffffe00000000;
  p_Var1 = &(this->m_dirs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_dirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_dirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_dirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_dirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_dirs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  initialize(this,fileName);
  return;
}

Assistant:

inline
File::File( std::istream & stream, const std::string & fileName )
	:	m_stream( stream )
{
	initialize( fileName );
}